

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O0

char * A64NamedImmMapper_toString(A64NamedImmMapper *N,uint32_t Value,_Bool *Valid)

{
  uint local_2c;
  uint i;
  _Bool *Valid_local;
  uint32_t Value_local;
  A64NamedImmMapper *N_local;
  
  local_2c = 0;
  while( true ) {
    if (N->NumPairs <= (ulong)local_2c) {
      *Valid = false;
      return (char *)0x0;
    }
    if (N->Pairs[local_2c].Value == Value) break;
    local_2c = local_2c + 1;
  }
  *Valid = true;
  return N->Pairs[local_2c].Name;
}

Assistant:

char *A64NamedImmMapper_toString(A64NamedImmMapper *N, uint32_t Value, bool *Valid)
{
	unsigned i;
	for (i = 0; i < N->NumPairs; ++i) {
		if (N->Pairs[i].Value == Value) {
			*Valid = true;
			return N->Pairs[i].Name;
		}
	}

	*Valid = false;
	return 0;
}